

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::resolveBindTargets
          (Compilation *this,BindDirectiveSyntax *syntax,Scope *scope,ResolvedBind *resolvedBind)

{
  NameSyntax *pNVar1;
  BindTargetListSyntax *pBVar2;
  SyntaxNode *pSVar3;
  MemberSyntax *pMVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  DefinitionSymbol *pDVar8;
  Diagnostic *pDVar9;
  Diagnostic *this_00;
  InstanceBodySymbol *pIVar10;
  ulong uVar11;
  ASTContext *context;
  Compilation *context_00;
  long lVar12;
  string_view sVar13;
  SourceRange SVar14;
  Token name;
  Token name_1;
  LookupResult result;
  undefined1 local_2e0 [24];
  Symbol *pSStack_2c8;
  TempVarSymbol *local_2c0;
  RandomizeDetails *pRStack_2b8;
  AssertionInstanceDetails *local_2b0;
  DefinitionLookupResult local_2a8;
  Token local_288;
  undefined1 local_278 [32];
  TempVarSymbol *local_258;
  RandomizeDetails *local_250;
  Symbol local_248 [3];
  Type *local_188;
  Type *local_180;
  Type *local_178;
  undefined1 local_170 [72];
  Type *local_128;
  Type *local_120;
  Diagnostic local_118 [2];
  
  local_2e0._8_4_ = 0xffffffff;
  local_2e0._16_8_ = 0;
  pSStack_2c8 = (Symbol *)0x0;
  local_2c0 = (TempVarSymbol *)0x0;
  pRStack_2b8 = (RandomizeDetails *)0x0;
  local_2b0 = (AssertionInstanceDetails *)0x0;
  local_2e0._0_8_ = scope;
  if (syntax->targetInstances == (BindTargetListSyntax *)0x0) {
    local_278._0_8_ = (DefinitionSymbol *)0x0;
    local_278._8_5_ = 0;
    local_278._13_3_ = 0;
    local_278._16_5_ = 0;
    local_258 = (TempVarSymbol *)0x0;
    local_250 = (RandomizeDetails *)0x4;
    local_180 = (Type *)0x0;
    local_178 = (Type *)0x2;
    local_170._64_8_ = local_118;
    local_128 = (Type *)0x0;
    local_120 = (Type *)0x2;
    context_00 = (Compilation *)local_2e0;
    local_278._24_8_ = local_248;
    local_188 = (Type *)local_170;
    Lookup::name((syntax->target).ptr,(ASTContext *)context_00,
                 (bitmask<slang::ast::LookupFlags>)0x96,(LookupResult *)local_278);
    uVar5 = local_278._0_8_;
    pSVar3 = (SyntaxNode *)(syntax->target).ptr;
    if ((DefinitionSymbol *)local_278._0_8_ == (DefinitionSymbol *)0x0) {
      if (pSVar3->kind == IdentifierName) {
        local_288._0_8_ = *(undefined8 *)(pSVar3 + 1);
        local_288.info = (Info *)pSVar3[1].parent;
        sVar13 = parsing::Token::valueText(&local_288);
        SVar14 = parsing::Token::range(&local_288);
        context_00 = this;
        getDefinition(&local_2a8,this,sVar13,scope,SVar14,(DiagCode)0xcf0006);
        if ((DefinitionSymbol *)local_2a8.definition == (DefinitionSymbol *)0x0) {
          SmallVectorBase<slang::Diagnostic>::cleanup
                    ((SmallVectorBase<slang::Diagnostic> *)(local_170 + 0x40),
                     (EVP_PKEY_CTX *)context_00);
          if (local_188 != (Type *)local_170) {
            operator_delete(local_188);
          }
          if ((Symbol *)local_278._24_8_ == local_248) {
            return;
          }
          operator_delete((void *)local_278._24_8_);
          return;
        }
        if (((Symbol *)&(local_2a8.definition)->kind)->kind == Definition) {
          resolvedBind->defTarget = (DefinitionSymbol *)local_2a8.definition;
        }
      }
    }
    else if ((((Symbol *)local_278._0_8_)->kind == Instance) &&
            (pDVar8 = InstanceSymbol::getDefinition((InstanceSymbol *)local_278._0_8_),
            pDVar8->definitionKind < Program)) {
      context_00 = (Compilation *)local_278;
      SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                ((SmallVectorBase<slang::ast::Symbol_const*> *)resolvedBind,(Symbol **)context_00);
    }
    else {
      SVar14 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
      pDVar9 = Scope::addDiag(scope,(DiagCode)0xd000d,SVar14);
      Diagnostic::operator<<(pDVar9,*(string_view *)(uVar5 + 8));
      context_00 = (Compilation *)0x50001;
      Diagnostic::addNote(pDVar9,(DiagCode)0x50001,*(SourceLocation *)(uVar5 + 0x18));
    }
    if (resolvedBind->defTarget == (DefinitionSymbol *)0x0) {
      context_00 = (Compilation *)local_2e0;
      LookupResult::reportDiags((LookupResult *)local_278,(ASTContext *)context_00);
    }
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)(local_170 + 0x40),(EVP_PKEY_CTX *)context_00);
    if (local_188 != (Type *)local_170) {
      operator_delete(local_188);
    }
    if ((Symbol *)local_278._24_8_ != local_248) {
      operator_delete((void *)local_278._24_8_);
    }
  }
  else {
    pNVar1 = (syntax->target).ptr;
    if ((pNVar1->super_ExpressionSyntax).super_SyntaxNode.kind != IdentifierName) {
      return;
    }
    local_2a8.definition = *(Symbol **)&pNVar1[1].super_ExpressionSyntax.super_SyntaxNode;
    local_2a8.configRoot =
         (ConfigBlockSymbol *)pNVar1[1].super_ExpressionSyntax.super_SyntaxNode.parent;
    sVar13 = parsing::Token::valueText((Token *)&local_2a8);
    SVar14 = parsing::Token::range((Token *)&local_2a8);
    getDefinition((DefinitionLookupResult *)local_278,this,sVar13,scope,SVar14,(DiagCode)0xcf0006);
    uVar5 = local_278._0_8_;
    if ((DefinitionSymbol *)local_278._0_8_ == (DefinitionSymbol *)0x0) {
      return;
    }
    pBVar2 = syntax->targetInstances;
    uVar11 = (pBVar2->targets).elements._M_extent._M_extent_value + 1;
    if (1 < uVar11) {
      uVar11 = uVar11 >> 1;
      lVar12 = 0;
      do {
        ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((pBVar2->targets).elements._M_ptr)->super_ConstTokenOrSyntax)
                                     .
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar12));
        pSVar3 = *ppSVar7;
        local_278._16_5_ = 0;
        local_278._0_8_ = (DefinitionSymbol *)0x0;
        local_278._8_5_ = 0;
        local_278._13_3_ = 0;
        local_278._24_8_ = local_248;
        local_258 = (TempVarSymbol *)0x0;
        local_250 = (RandomizeDetails *)0x4;
        local_188 = (Type *)local_170;
        local_180 = (Type *)0x0;
        local_178 = (Type *)0x2;
        local_170._64_8_ = local_118;
        local_128 = (Type *)0x0;
        local_120 = (Type *)0x2;
        Lookup::name((NameSyntax *)pSVar3,(ASTContext *)local_2e0,
                     (bitmask<slang::ast::LookupFlags>)0x96,(LookupResult *)local_278);
        context = (ASTContext *)local_2e0;
        LookupResult::reportDiags((LookupResult *)local_278,context);
        uVar6 = local_278._0_8_;
        if ((DefinitionSymbol *)local_278._0_8_ != (DefinitionSymbol *)0x0) {
          if ((((Symbol *)local_278._0_8_)->kind == Instance) &&
             (pDVar8 = InstanceSymbol::getDefinition((InstanceSymbol *)local_278._0_8_),
             pDVar8->definitionKind < Program)) {
            pDVar8 = InstanceSymbol::getDefinition((InstanceSymbol *)local_278._0_8_);
            if (pDVar8 != (DefinitionSymbol *)uVar5) {
              SVar14 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
              pDVar9 = Scope::addDiag(scope,(DiagCode)0x23000d,SVar14);
              this_00 = Diagnostic::operator<<(pDVar9,*(string_view *)(local_278._0_8_ + 8));
              Diagnostic::operator<<(this_00,*(string_view *)(uVar5 + 8));
              SVar14 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(syntax->target).ptr);
              Diagnostic::operator<<(pDVar9,SVar14);
              Diagnostic::addNote(pDVar9,(DiagCode)0x50001,
                                  *(SourceLocation *)(local_278._0_8_ + 0x18));
            }
            context = (ASTContext *)local_278;
            SmallVectorBase<slang::ast::Symbol_const*>::
            emplace_back<slang::ast::Symbol_const*const&>
                      ((SmallVectorBase<slang::ast::Symbol_const*> *)resolvedBind,(Symbol **)context
                      );
          }
          else {
            SVar14 = slang::syntax::SyntaxNode::sourceRange(pSVar3);
            pDVar9 = Scope::addDiag(scope,(DiagCode)0xd000d,SVar14);
            Diagnostic::operator<<(pDVar9,*(string_view *)(uVar6 + 8));
            context = (ASTContext *)0x50001;
            Diagnostic::addNote(pDVar9,(DiagCode)0x50001,*(SourceLocation *)(uVar6 + 0x18));
          }
        }
        SmallVectorBase<slang::Diagnostic>::cleanup
                  ((SmallVectorBase<slang::Diagnostic> *)(local_170 + 0x40),(EVP_PKEY_CTX *)context)
        ;
        if (local_188 != (Type *)local_170) {
          operator_delete(local_188);
        }
        if ((Symbol *)local_278._24_8_ != local_248) {
          operator_delete((void *)local_278._24_8_);
        }
        lVar12 = lVar12 + 0x30;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
  }
  pMVar4 = (syntax->instantiation).ptr;
  if ((pMVar4->super_SyntaxNode).kind == HierarchyInstantiation) {
    sVar13 = parsing::Token::valueText((Token *)(pMVar4 + 1));
    tryGetDefinition((DefinitionLookupResult *)local_278,this,sVar13,scope);
    (resolvedBind->instanceDef).configRule =
         (ConfigRule *)CONCAT35(local_278._21_3_,local_278._16_5_);
    (resolvedBind->instanceDef).definition = (Symbol *)local_278._0_8_;
    (resolvedBind->instanceDef).configRoot =
         (ConfigBlockSymbol *)CONCAT35(local_278._13_3_,local_278._8_5_);
    if ((((resolvedBind->instanceDef).configRoot == (ConfigBlockSymbol *)0x0) &&
        (pIVar10 = Scope::getContainingInstance(scope), pIVar10 != (InstanceBodySymbol *)0x0)) &&
       (pIVar10->parentInstance != (InstanceSymbol *)0x0)) {
      resolvedBind->resolvedConfig = pIVar10->parentInstance->resolvedConfig;
    }
  }
  return;
}

Assistant:

void Compilation::resolveBindTargets(const BindDirectiveSyntax& syntax, const Scope& scope,
                                     ResolvedBind& resolvedBind) {
    auto checkValidTarget = [&](const Symbol& symbol, const SyntaxNode& nameSyntax) {
        if (symbol.kind == SymbolKind::Instance) {
            auto defKind = symbol.as<InstanceSymbol>().getDefinition().definitionKind;
            if (defKind == DefinitionKind::Module || defKind == DefinitionKind::Interface)
                return true;
        }

        auto& diag = scope.addDiag(diag::InvalidBindTarget, nameSyntax.sourceRange());
        diag << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        return false;
    };

    // If an instance list is given, then the target name must be a definition name.
    // Otherwise, the target name can be either an instance name or a definition name,
    // preferencing the instance if found.
    ASTContext context(scope, LookupLocation::max);
    bitmask<LookupFlags> flags = LookupFlags::ForceHierarchical |
                                 LookupFlags::DisallowWildcardImport | LookupFlags::NoSelectors;

    if (syntax.targetInstances) {
        if (syntax.target->kind != SyntaxKind::IdentifierName)
            return;

        Token name = syntax.target->as<IdentifierNameSyntax>().identifier;
        auto targetDef =
            getDefinition(name.valueText(), scope, name.range(), diag::UnknownModule).definition;
        if (!targetDef)
            return;

        for (auto inst : syntax.targetInstances->targets) {
            LookupResult result;
            Lookup::name(*inst, context, flags, result);
            result.reportDiags(context);

            if (result.found) {
                if (checkValidTarget(*result.found, *inst)) {
                    if (&result.found->as<InstanceSymbol>().getDefinition() != targetDef) {
                        auto& diag = scope.addDiag(diag::WrongBindTargetDef, inst->sourceRange());
                        diag << result.found->name << targetDef->name;
                        diag << syntax.target->sourceRange();
                        diag.addNote(diag::NoteDeclarationHere, result.found->location);
                    }
                    resolvedBind.instTargets.push_back(result.found);
                }
            }
        }
    }
    else {
        LookupResult result;
        Lookup::name(*syntax.target, context, flags, result);

        if (result.found) {
            if (checkValidTarget(*result.found, *syntax.target))
                resolvedBind.instTargets.push_back(result.found);
        }
        else {
            // If we didn't find the name as an instance, try as a definition.
            if (syntax.target->kind == SyntaxKind::IdentifierName) {
                Token name = syntax.target->as<IdentifierNameSyntax>().identifier;
                auto def = getDefinition(name.valueText(), scope, name.range(), diag::UnknownModule)
                               .definition;
                if (!def)
                    return;

                if (def->kind == SymbolKind::Definition)
                    resolvedBind.defTarget = &def->as<DefinitionSymbol>();
            }
        }

        if (!resolvedBind.defTarget)
            result.reportDiags(context);
    }

    // Resolve the actual instantiation definition now, since it depends on the current
    // config mapping, not the mapping of the target scope(s).
    if (syntax.instantiation->kind == SyntaxKind::HierarchyInstantiation) {
        auto& his = syntax.instantiation->as<HierarchyInstantiationSyntax>();
        resolvedBind.instanceDef = tryGetDefinition(his.type.valueText(), scope);

        // If we did not directly resolve to a new config root, look for a config
        // in our parent scope. If there is one, pretend we've created a new
        // config root at the targeted bind instance, so that modules underneath
        // the bound instance get the correct config.
        if (!resolvedBind.instanceDef.configRoot) {
            if (auto inst = scope.getContainingInstance(); inst && inst->parentInstance)
                resolvedBind.resolvedConfig = inst->parentInstance->resolvedConfig;
        }
    }
}